

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O2

void __thiscall SetWriter_write_Test::TestBody(SetWriter_write_Test *this)

{
  container *pcVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer *__ptr;
  char *message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  vector_writer expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  difference_type num_actual_bytes;
  difference_type num_expected_bytes;
  
  expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.policy_.
  bytes_ = &bytes;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
  bytes_consumed_ = 0;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.flushed_ =
       false;
  expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
  _vptr_writer_base = (_func_int **)&PTR__vector_writer_00189c40;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  pstore::serialize::archive::writer_base<pstore::serialize::archive::details::vector_writer_policy>
  ::put<unsigned_long>
            (&expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>,
             (unsigned_long *)&gtest_ar);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  pstore::serialize::archive::writer_base<pstore::serialize::archive::details::vector_writer_policy>
  ::put<int>(&expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>,
             (int *)&gtest_ar);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  pstore::serialize::archive::writer_base<pstore::serialize::archive::details::vector_writer_policy>
  ::put<int>(&expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>,
             (int *)&gtest_ar);
  gtest_ar._0_4_ = 5;
  pstore::serialize::archive::writer_base<pstore::serialize::archive::details::vector_writer_policy>
  ::put<int>(&expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>,
             (int *)&gtest_ar);
  num_expected_bytes =
       (long)((expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
               .policy_.bytes_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)((expected.super_writer_base<pstore::serialize::archive::details::vector_writer_policy>
               .policy_.bytes_)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->super_SetWriter).writer_.
           super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.policy_.
           bytes_;
  num_actual_bytes =
       (long)(pcVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pcVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"num_expected_bytes","num_actual_bytes",&num_expected_bytes,
             &num_actual_bytes);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0xd0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&gtest_ar_);
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    local_98._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_.success_ =
         std::__equal<true>::equal<unsigned_char>
                   (((expected.
                      super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
                      policy_.bytes_)->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start,
                    ((expected.
                      super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
                      policy_.bytes_)->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish,
                    (((this->super_SetWriter).writer_.
                      super_writer_base<pstore::serialize::archive::details::vector_writer_policy>.
                      policy_.bytes_)->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start);
    this_00 = &gtest_ar_.message_;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (gtest_ar_.success_) goto LAB_0011877c;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)
               "std::equal (std::begin (expected), std::end (expected), std::begin (writer_))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_standard_types.cpp"
               ,0xd2,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  if (local_98._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_98._M_head_impl + 8))();
  }
LAB_0011877c:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  pstore::serialize::archive::vector_writer::~vector_writer(&expected);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

TEST_F (SetWriter, write) {
    std::vector<std::uint8_t> bytes;
    pstore::serialize::archive::vector_writer expected{bytes};
    pstore::serialize::write (expected, std::size_t{3});
    pstore::serialize::write (expected, int{2});
    pstore::serialize::write (expected, int{3});
    pstore::serialize::write (expected, int{5});

    auto const num_expected_bytes = std::distance (std::begin (expected), std::end (expected));
    auto const num_actual_bytes = std::distance (std::begin (writer_), std::end (writer_));
    ASSERT_EQ (num_expected_bytes, num_actual_bytes);

    EXPECT_TRUE (std::equal (std::begin (expected), std::end (expected), std::begin (writer_)));
}